

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

bool mxx::
     is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
               (undefined8 begin,undefined8 end,undefined8 param_3)

{
  bool bVar1;
  comm *comm_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  
  bVar1 = impl::
          is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
                    (begin,end,param_3);
  return bVar1;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm = mxx::comm()) {
    return impl::is_sorted(begin, end, comp, comm);
}